

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  char cVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int32_t *piVar11;
  int in_ECX;
  uint uVar12;
  int in_EDX;
  undefined8 *in_RSI;
  int in_R8D;
  uint in_R9D;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m256i offset;
  int log_range_out;
  __m256i x;
  __m256i cospi32;
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  int32_t *cospi;
  int in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 in_stack_fffffffffffffb68;
  char local_488;
  undefined1 local_440 [32];
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  byte local_360;
  char local_354;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  piVar11 = cospi_arr(in_EDX);
  local_354 = (char)in_EDX;
  uVar8 = 1 << (local_354 - 1U & 0x1f);
  auVar13 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar13 = vpinsrd_avx(auVar13,uVar8,2);
  vpinsrd_avx(auVar13,uVar8,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar13 = vpinsrd_avx(auVar13,uVar8,2);
  vpinsrd_avx(auVar13,uVar8,3);
  iVar9 = 8;
  if (in_ECX != 0) {
    iVar9 = 6;
  }
  if (in_R8D + iVar9 < 0x10) {
    local_488 = '\x10';
  }
  else {
    local_488 = '\b';
    if (in_ECX != 0) {
      local_488 = '\x06';
    }
    local_488 = (char)in_R8D + local_488;
  }
  uVar12 = -(1 << (local_488 - 1U & 0x1f));
  auVar13 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar13 = vpinsrd_avx(auVar13,uVar12,2);
  auVar13 = vpinsrd_avx(auVar13,uVar12,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar12),uVar12,1);
  auVar15 = vpinsrd_avx(auVar15,uVar12,2);
  auVar15 = vpinsrd_avx(auVar15,uVar12,3);
  local_1c0 = auVar13._0_8_;
  uStack_1b8 = auVar13._8_8_;
  uStack_1b0 = auVar15._0_8_;
  uStack_1a8 = auVar15._8_8_;
  local_3e0 = local_1c0;
  uStack_3d8 = uStack_1b8;
  uStack_3d0 = uStack_1b0;
  uStack_3c8 = uStack_1a8;
  uVar10 = (1 << (local_488 - 1U & 0x1f)) - 1;
  auVar13 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar13 = vpinsrd_avx(auVar13,uVar10,2);
  auVar13 = vpinsrd_avx(auVar13,uVar10,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar10),uVar10,1);
  auVar15 = vpinsrd_avx(auVar15,uVar10,2);
  auVar15 = vpinsrd_avx(auVar15,uVar10,3);
  uVar8 = piVar11[0x20];
  auVar14 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar14 = vpinsrd_avx(auVar14,uVar8,2);
  auVar14 = vpinsrd_avx(auVar14,uVar8,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
  auVar1 = vpinsrd_avx(auVar1,uVar8,2);
  auVar1 = vpinsrd_avx(auVar1,uVar8,3);
  local_440._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar1;
  auVar14 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
  half_btf_0_avx2((__m256i *)CONCAT44(uVar8,uVar10),
                  (__m256i *)CONCAT44(uVar12,in_stack_fffffffffffffb68),
                  (__m256i *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60),
                  in_stack_fffffffffffffb5c);
  local_440._16_8_ = auVar14._0_8_;
  local_440._24_8_ = auVar14._8_8_;
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      cVar7 = '\x10';
    }
    else {
      cVar7 = (char)in_R8D + '\x06';
    }
    uVar8 = -(1 << (cVar7 - 1U & 0x1f));
    auVar13 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
    auVar13 = vpinsrd_avx(auVar13,uVar8,2);
    auVar13 = vpinsrd_avx(auVar13,uVar8,3);
    auVar15 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
    auVar15 = vpinsrd_avx(auVar15,uVar8,2);
    auVar15 = vpinsrd_avx(auVar15,uVar8,3);
    local_100 = auVar13._0_8_;
    uStack_f8 = auVar13._8_8_;
    uStack_f0 = auVar15._0_8_;
    uStack_e8 = auVar15._8_8_;
    local_3e0 = local_100;
    uStack_3d8 = uStack_f8;
    uStack_3d0 = uStack_f0;
    uStack_3c8 = uStack_e8;
    uVar8 = (1 << (cVar7 - 1U & 0x1f)) - 1;
    auVar13 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
    auVar13 = vpinsrd_avx(auVar13,uVar8,2);
    auVar15 = vpinsrd_avx(auVar13,uVar8,3);
    auVar13 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
    auVar13 = vpinsrd_avx(auVar13,uVar8,2);
    auVar13 = vpinsrd_avx(auVar13,uVar8,3);
    auVar13 = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar13;
    auVar15 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar15;
    if (in_R9D != 0) {
      local_360 = (byte)in_R9D;
      uVar8 = (1 << (local_360 & 0x1f)) >> 1;
      auVar1 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
      auVar1 = vpinsrd_avx(auVar1,uVar8,2);
      auVar1 = vpinsrd_avx(auVar1,uVar8,3);
      auVar2 = vpinsrd_avx(ZEXT416(uVar8),uVar8,1);
      auVar2 = vpinsrd_avx(auVar2,uVar8,2);
      auVar2 = vpinsrd_avx(auVar2,uVar8,3);
      uStack_70 = auVar2._0_8_;
      uStack_68 = auVar2._8_8_;
      auVar4._16_8_ = auVar14._0_8_;
      auVar4._0_16_ = local_440._0_16_;
      auVar4._24_8_ = auVar14._8_8_;
      auVar3._16_8_ = uStack_70;
      auVar3._0_16_ = auVar1;
      auVar3._24_8_ = uStack_68;
      auVar3 = vpaddd_avx2(auVar4,auVar3);
      local_440 = vpsrad_avx2(auVar3,ZEXT416(in_R9D));
    }
  }
  uStack_3e8 = auVar15._8_8_;
  uStack_3f0 = auVar15._0_8_;
  auVar5._8_8_ = uStack_3d8;
  auVar5._0_8_ = local_3e0;
  auVar5._16_8_ = uStack_3d0;
  auVar5._24_8_ = uStack_3c8;
  auVar3 = vpmaxsd_avx2(local_440,auVar5);
  auVar6._16_8_ = uStack_3f0;
  auVar6._0_16_ = auVar13;
  auVar6._24_8_ = uStack_3e8;
  auVar3 = vpminsd_avx2(auVar3,auVar6);
  local_440._0_8_ = auVar3._0_8_;
  local_440._8_8_ = auVar3._8_8_;
  local_440._16_8_ = auVar3._16_8_;
  local_440._24_8_ = auVar3._24_8_;
  *in_RSI = local_440._0_8_;
  in_RSI[1] = local_440._8_8_;
  in_RSI[2] = local_440._16_8_;
  in_RSI[3] = local_440._24_8_;
  in_RSI[4] = local_440._0_8_;
  in_RSI[5] = local_440._8_8_;
  in_RSI[6] = local_440._16_8_;
  in_RSI[7] = local_440._24_8_;
  in_RSI[8] = local_440._0_8_;
  in_RSI[9] = local_440._8_8_;
  in_RSI[10] = local_440._16_8_;
  in_RSI[0xb] = local_440._24_8_;
  in_RSI[0xc] = local_440._0_8_;
  in_RSI[0xd] = local_440._8_8_;
  in_RSI[0xe] = local_440._16_8_;
  in_RSI[0xf] = local_440._24_8_;
  in_RSI[0x10] = local_440._0_8_;
  in_RSI[0x11] = local_440._8_8_;
  in_RSI[0x12] = local_440._16_8_;
  in_RSI[0x13] = local_440._24_8_;
  in_RSI[0x14] = local_440._0_8_;
  in_RSI[0x15] = local_440._8_8_;
  in_RSI[0x16] = local_440._16_8_;
  in_RSI[0x17] = local_440._24_8_;
  in_RSI[0x18] = local_440._0_8_;
  in_RSI[0x19] = local_440._8_8_;
  in_RSI[0x1a] = local_440._16_8_;
  in_RSI[0x1b] = local_440._24_8_;
  in_RSI[0x1c] = local_440._0_8_;
  in_RSI[0x1d] = local_440._8_8_;
  in_RSI[0x1e] = local_440._16_8_;
  in_RSI[0x1f] = local_440._24_8_;
  in_RSI[0x20] = local_440._0_8_;
  in_RSI[0x21] = local_440._8_8_;
  in_RSI[0x22] = local_440._16_8_;
  in_RSI[0x23] = local_440._24_8_;
  in_RSI[0x24] = local_440._0_8_;
  in_RSI[0x25] = local_440._8_8_;
  in_RSI[0x26] = local_440._16_8_;
  in_RSI[0x27] = local_440._24_8_;
  in_RSI[0x28] = local_440._0_8_;
  in_RSI[0x29] = local_440._8_8_;
  in_RSI[0x2a] = local_440._16_8_;
  in_RSI[0x2b] = local_440._24_8_;
  in_RSI[0x2c] = local_440._0_8_;
  in_RSI[0x2d] = local_440._8_8_;
  in_RSI[0x2e] = local_440._16_8_;
  in_RSI[0x2f] = local_440._24_8_;
  in_RSI[0x30] = local_440._0_8_;
  in_RSI[0x31] = local_440._8_8_;
  in_RSI[0x32] = local_440._16_8_;
  in_RSI[0x33] = local_440._24_8_;
  in_RSI[0x34] = local_440._0_8_;
  in_RSI[0x35] = local_440._8_8_;
  in_RSI[0x36] = local_440._16_8_;
  in_RSI[0x37] = local_440._24_8_;
  in_RSI[0x38] = local_440._0_8_;
  in_RSI[0x39] = local_440._8_8_;
  in_RSI[0x3a] = local_440._16_8_;
  in_RSI[0x3b] = local_440._24_8_;
  in_RSI[0x3c] = local_440._0_8_;
  in_RSI[0x3d] = local_440._8_8_;
  in_RSI[0x3e] = local_440._16_8_;
  in_RSI[0x3f] = local_440._24_8_;
  in_RSI[0x40] = local_440._0_8_;
  in_RSI[0x41] = local_440._8_8_;
  in_RSI[0x42] = local_440._16_8_;
  in_RSI[0x43] = local_440._24_8_;
  in_RSI[0x44] = local_440._0_8_;
  in_RSI[0x45] = local_440._8_8_;
  in_RSI[0x46] = local_440._16_8_;
  in_RSI[0x47] = local_440._24_8_;
  in_RSI[0x48] = local_440._0_8_;
  in_RSI[0x49] = local_440._8_8_;
  in_RSI[0x4a] = local_440._16_8_;
  in_RSI[0x4b] = local_440._24_8_;
  in_RSI[0x4c] = local_440._0_8_;
  in_RSI[0x4d] = local_440._8_8_;
  in_RSI[0x4e] = local_440._16_8_;
  in_RSI[0x4f] = local_440._24_8_;
  in_RSI[0x50] = local_440._0_8_;
  in_RSI[0x51] = local_440._8_8_;
  in_RSI[0x52] = local_440._16_8_;
  in_RSI[0x53] = local_440._24_8_;
  in_RSI[0x54] = local_440._0_8_;
  in_RSI[0x55] = local_440._8_8_;
  in_RSI[0x56] = local_440._16_8_;
  in_RSI[0x57] = local_440._24_8_;
  in_RSI[0x58] = local_440._0_8_;
  in_RSI[0x59] = local_440._8_8_;
  in_RSI[0x5a] = local_440._16_8_;
  in_RSI[0x5b] = local_440._24_8_;
  in_RSI[0x5c] = local_440._0_8_;
  in_RSI[0x5d] = local_440._8_8_;
  in_RSI[0x5e] = local_440._16_8_;
  in_RSI[0x5f] = local_440._24_8_;
  in_RSI[0x60] = local_440._0_8_;
  in_RSI[0x61] = local_440._8_8_;
  in_RSI[0x62] = local_440._16_8_;
  in_RSI[99] = local_440._24_8_;
  in_RSI[100] = local_440._0_8_;
  in_RSI[0x65] = local_440._8_8_;
  in_RSI[0x66] = local_440._16_8_;
  in_RSI[0x67] = local_440._24_8_;
  in_RSI[0x68] = local_440._0_8_;
  in_RSI[0x69] = local_440._8_8_;
  in_RSI[0x6a] = local_440._16_8_;
  in_RSI[0x6b] = local_440._24_8_;
  in_RSI[0x6c] = local_440._0_8_;
  in_RSI[0x6d] = local_440._8_8_;
  in_RSI[0x6e] = local_440._16_8_;
  in_RSI[0x6f] = local_440._24_8_;
  in_RSI[0x70] = local_440._0_8_;
  in_RSI[0x71] = local_440._8_8_;
  in_RSI[0x72] = local_440._16_8_;
  in_RSI[0x73] = local_440._24_8_;
  in_RSI[0x74] = local_440._0_8_;
  in_RSI[0x75] = local_440._8_8_;
  in_RSI[0x76] = local_440._16_8_;
  in_RSI[0x77] = local_440._24_8_;
  in_RSI[0x78] = local_440._0_8_;
  in_RSI[0x79] = local_440._8_8_;
  in_RSI[0x7a] = local_440._16_8_;
  in_RSI[0x7b] = local_440._24_8_;
  in_RSI[0x7c] = local_440._0_8_;
  in_RSI[0x7d] = local_440._8_8_;
  in_RSI[0x7e] = local_440._16_8_;
  in_RSI[0x7f] = local_440._24_8_;
  in_RSI[0x80] = local_440._0_8_;
  in_RSI[0x81] = local_440._8_8_;
  in_RSI[0x82] = local_440._16_8_;
  in_RSI[0x83] = local_440._24_8_;
  in_RSI[0x84] = local_440._0_8_;
  in_RSI[0x85] = local_440._8_8_;
  in_RSI[0x86] = local_440._16_8_;
  in_RSI[0x87] = local_440._24_8_;
  in_RSI[0x88] = local_440._0_8_;
  in_RSI[0x89] = local_440._8_8_;
  in_RSI[0x8a] = local_440._16_8_;
  in_RSI[0x8b] = local_440._24_8_;
  in_RSI[0x8c] = local_440._0_8_;
  in_RSI[0x8d] = local_440._8_8_;
  in_RSI[0x8e] = local_440._16_8_;
  in_RSI[0x8f] = local_440._24_8_;
  in_RSI[0x90] = local_440._0_8_;
  in_RSI[0x91] = local_440._8_8_;
  in_RSI[0x92] = local_440._16_8_;
  in_RSI[0x93] = local_440._24_8_;
  in_RSI[0x94] = local_440._0_8_;
  in_RSI[0x95] = local_440._8_8_;
  in_RSI[0x96] = local_440._16_8_;
  in_RSI[0x97] = local_440._24_8_;
  in_RSI[0x98] = local_440._0_8_;
  in_RSI[0x99] = local_440._8_8_;
  in_RSI[0x9a] = local_440._16_8_;
  in_RSI[0x9b] = local_440._24_8_;
  in_RSI[0x9c] = local_440._0_8_;
  in_RSI[0x9d] = local_440._8_8_;
  in_RSI[0x9e] = local_440._16_8_;
  in_RSI[0x9f] = local_440._24_8_;
  in_RSI[0xa0] = local_440._0_8_;
  in_RSI[0xa1] = local_440._8_8_;
  in_RSI[0xa2] = local_440._16_8_;
  in_RSI[0xa3] = local_440._24_8_;
  in_RSI[0xa4] = local_440._0_8_;
  in_RSI[0xa5] = local_440._8_8_;
  in_RSI[0xa6] = local_440._16_8_;
  in_RSI[0xa7] = local_440._24_8_;
  in_RSI[0xa8] = local_440._0_8_;
  in_RSI[0xa9] = local_440._8_8_;
  in_RSI[0xaa] = local_440._16_8_;
  in_RSI[0xab] = local_440._24_8_;
  in_RSI[0xac] = local_440._0_8_;
  in_RSI[0xad] = local_440._8_8_;
  in_RSI[0xae] = local_440._16_8_;
  in_RSI[0xaf] = local_440._24_8_;
  in_RSI[0xb0] = local_440._0_8_;
  in_RSI[0xb1] = local_440._8_8_;
  in_RSI[0xb2] = local_440._16_8_;
  in_RSI[0xb3] = local_440._24_8_;
  in_RSI[0xb4] = local_440._0_8_;
  in_RSI[0xb5] = local_440._8_8_;
  in_RSI[0xb6] = local_440._16_8_;
  in_RSI[0xb7] = local_440._24_8_;
  in_RSI[0xb8] = local_440._0_8_;
  in_RSI[0xb9] = local_440._8_8_;
  in_RSI[0xba] = local_440._16_8_;
  in_RSI[0xbb] = local_440._24_8_;
  in_RSI[0xbc] = local_440._0_8_;
  in_RSI[0xbd] = local_440._8_8_;
  in_RSI[0xbe] = local_440._16_8_;
  in_RSI[0xbf] = local_440._24_8_;
  in_RSI[0xc0] = local_440._0_8_;
  in_RSI[0xc1] = local_440._8_8_;
  in_RSI[0xc2] = local_440._16_8_;
  in_RSI[0xc3] = local_440._24_8_;
  in_RSI[0xc4] = local_440._0_8_;
  in_RSI[0xc5] = local_440._8_8_;
  in_RSI[0xc6] = local_440._16_8_;
  in_RSI[199] = local_440._24_8_;
  in_RSI[200] = local_440._0_8_;
  in_RSI[0xc9] = local_440._8_8_;
  in_RSI[0xca] = local_440._16_8_;
  in_RSI[0xcb] = local_440._24_8_;
  in_RSI[0xcc] = local_440._0_8_;
  in_RSI[0xcd] = local_440._8_8_;
  in_RSI[0xce] = local_440._16_8_;
  in_RSI[0xcf] = local_440._24_8_;
  in_RSI[0xd0] = local_440._0_8_;
  in_RSI[0xd1] = local_440._8_8_;
  in_RSI[0xd2] = local_440._16_8_;
  in_RSI[0xd3] = local_440._24_8_;
  in_RSI[0xd4] = local_440._0_8_;
  in_RSI[0xd5] = local_440._8_8_;
  in_RSI[0xd6] = local_440._16_8_;
  in_RSI[0xd7] = local_440._24_8_;
  in_RSI[0xd8] = local_440._0_8_;
  in_RSI[0xd9] = local_440._8_8_;
  in_RSI[0xda] = local_440._16_8_;
  in_RSI[0xdb] = local_440._24_8_;
  in_RSI[0xdc] = local_440._0_8_;
  in_RSI[0xdd] = local_440._8_8_;
  in_RSI[0xde] = local_440._16_8_;
  in_RSI[0xdf] = local_440._24_8_;
  in_RSI[0xe0] = local_440._0_8_;
  in_RSI[0xe1] = local_440._8_8_;
  in_RSI[0xe2] = local_440._16_8_;
  in_RSI[0xe3] = local_440._24_8_;
  in_RSI[0xe4] = local_440._0_8_;
  in_RSI[0xe5] = local_440._8_8_;
  in_RSI[0xe6] = local_440._16_8_;
  in_RSI[0xe7] = local_440._24_8_;
  in_RSI[0xe8] = local_440._0_8_;
  in_RSI[0xe9] = local_440._8_8_;
  in_RSI[0xea] = local_440._16_8_;
  in_RSI[0xeb] = local_440._24_8_;
  in_RSI[0xec] = local_440._0_8_;
  in_RSI[0xed] = local_440._8_8_;
  in_RSI[0xee] = local_440._16_8_;
  in_RSI[0xef] = local_440._24_8_;
  in_RSI[0xf0] = local_440._0_8_;
  in_RSI[0xf1] = local_440._8_8_;
  in_RSI[0xf2] = local_440._16_8_;
  in_RSI[0xf3] = local_440._24_8_;
  in_RSI[0xf4] = local_440._0_8_;
  in_RSI[0xf5] = local_440._8_8_;
  in_RSI[0xf6] = local_440._16_8_;
  in_RSI[0xf7] = local_440._24_8_;
  in_RSI[0xf8] = local_440._0_8_;
  in_RSI[0xf9] = local_440._8_8_;
  in_RSI[0xfa] = local_440._16_8_;
  in_RSI[0xfb] = local_440._24_8_;
  in_RSI[0xfc] = local_440._0_8_;
  in_RSI[0xfd] = local_440._8_8_;
  in_RSI[0xfe] = local_440._16_8_;
  in_RSI[0xff] = local_440._24_8_;
  return;
}

Assistant:

static void idct64_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);

  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);

  {
    __m256i x;

    // stage 1
    // stage 2
    // stage 3
    // stage 4
    // stage 5
    // stage 6
    x = half_btf_0_avx2(&cospi32, &in[0], &rnding, bit);

    // stage 8
    // stage 9
    // stage 10
    // stage 11
    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      clamp_lo = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
      clamp_hi = _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);
      if (out_shift != 0) {
        __m256i offset = _mm256_set1_epi32((1 << out_shift) >> 1);
        x = _mm256_add_epi32(x, offset);
        x = _mm256_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
      }
    }
    x = _mm256_max_epi32(x, clamp_lo);
    x = _mm256_min_epi32(x, clamp_hi);
    out[0] = x;
    out[1] = x;
    out[2] = x;
    out[3] = x;
    out[4] = x;
    out[5] = x;
    out[6] = x;
    out[7] = x;
    out[8] = x;
    out[9] = x;
    out[10] = x;
    out[11] = x;
    out[12] = x;
    out[13] = x;
    out[14] = x;
    out[15] = x;
    out[16] = x;
    out[17] = x;
    out[18] = x;
    out[19] = x;
    out[20] = x;
    out[21] = x;
    out[22] = x;
    out[23] = x;
    out[24] = x;
    out[25] = x;
    out[26] = x;
    out[27] = x;
    out[28] = x;
    out[29] = x;
    out[30] = x;
    out[31] = x;
    out[32] = x;
    out[33] = x;
    out[34] = x;
    out[35] = x;
    out[36] = x;
    out[37] = x;
    out[38] = x;
    out[39] = x;
    out[40] = x;
    out[41] = x;
    out[42] = x;
    out[43] = x;
    out[44] = x;
    out[45] = x;
    out[46] = x;
    out[47] = x;
    out[48] = x;
    out[49] = x;
    out[50] = x;
    out[51] = x;
    out[52] = x;
    out[53] = x;
    out[54] = x;
    out[55] = x;
    out[56] = x;
    out[57] = x;
    out[58] = x;
    out[59] = x;
    out[60] = x;
    out[61] = x;
    out[62] = x;
    out[63] = x;
  }
}